

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O1

int AF_A_LoopActiveSound(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *actor;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 uVar5;
  PClass *pPVar6;
  uint uVar7;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  FSoundID local_2c;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005d6a71;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    actor = (AActor *)(param->field_0).field_1.a;
    pVVar8 = param;
    uVar7 = numparam;
    if (actor != (AActor *)0x0) {
      if ((actor->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar4 = (**(actor->super_DThinker).super_DObject._vptr_DObject)(actor);
        (actor->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
      }
      pPVar6 = (actor->super_DThinker).super_DObject.Class;
      bVar9 = pPVar6 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar7 = (uint)bVar9;
      pVVar8 = (VMValue *)(ulong)(pPVar6 == pPVar3 || bVar9);
      if (pPVar6 != pPVar3 && !bVar9) {
        do {
          pPVar6 = pPVar6->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005d6a71;
      }
    }
    pPVar3 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005d6a46;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar5 = (**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
          puVar2[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar2[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar3 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005d6a71;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if ((actor->ActiveSound).super_FSoundID.ID != 0) {
        bVar9 = S_IsActorPlayingSomething(actor,2,-1);
        if (!bVar9) {
          local_2c.ID = (actor->ActiveSound).super_FSoundID.ID;
          S_Sound(actor,0x102,&local_2c,1.0,1.0);
        }
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005d6a46:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005d6a71:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x126,"int AF_A_LoopActiveSound(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LoopActiveSound)
{
	PARAM_ACTION_PROLOGUE;

	if (self->ActiveSound != 0 && !S_IsActorPlayingSomething (self, CHAN_VOICE, -1))
	{
		S_Sound (self, CHAN_VOICE|CHAN_LOOP, self->ActiveSound, 1, ATTN_NORM);
	}
	return 0;
}